

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O1

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::calcDeadReckoningRVW
          (DeadReckoningCalculator *this,WorldCoordinates *PositionOut,EulerAngles *OrientationOut,
          KFLOAT32 totalTimeSinceReset)

{
  Vector local_90;
  Vector local_78;
  WorldCoordinates local_60;
  WorldCoordinates local_40;
  
  DATA_TYPE::Vector::operator*(&local_78,&this->m_initLinearVelocity,totalTimeSinceReset);
  DATA_TYPE::WorldCoordinates::operator+(&local_60,&this->m_initPosition,&local_78);
  DATA_TYPE::Vector::operator*
            (&local_90,&this->m_initLinearAcceleration,
             (KFLOAT64)
             ((double)(float)totalTimeSinceReset * 0.5 * (double)(float)totalTimeSinceReset));
  DATA_TYPE::WorldCoordinates::operator+(&local_40,&local_60,&local_90);
  PositionOut->m_f64Z = local_40.m_f64Z;
  PositionOut->m_f64X = local_40.m_f64X;
  PositionOut->m_f64Y = local_40.m_f64Y;
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_40.super_DataTypeBase);
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_90.super_DataTypeBase);
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_60.super_DataTypeBase);
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_78.super_DataTypeBase);
  calcOrientation_simplified(this,OrientationOut,totalTimeSinceReset);
  return;
}

Assistant:

void DeadReckoningCalculator::calcDeadReckoningRVW(  WorldCoordinates & PositionOut, EulerAngles & OrientationOut, const KFLOAT32 totalTimeSinceReset )
{
    /* Position */
    PositionOut = ( m_initPosition + ( m_initLinearVelocity * totalTimeSinceReset ) +
                    ( m_initLinearAcceleration * ( 0.5 * totalTimeSinceReset * totalTimeSinceReset ) ) );
    //calcOrientation(OrientationOut);
    calcOrientation_simplified( OrientationOut, totalTimeSinceReset );
}